

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O3

void __thiscall
fmt::internal::BasicArgFormatter<fmt::internal::ArgFormatter<wchar_t>,_wchar_t>::visit_char
          (BasicArgFormatter<fmt::internal::ArgFormatter<wchar_t>,_wchar_t> *this,int value)

{
  long lVar1;
  wchar_t wVar2;
  uint uVar3;
  BasicWriter<wchar_t> *pBVar4;
  undefined8 *puVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  FormatSpec *pFVar9;
  undefined8 *puVar10;
  FormatError *this_00;
  long lVar11;
  Alignment AVar12;
  wchar_t __tmp;
  ulong uVar13;
  long lVar14;
  long lVar15;
  int *piVar16;
  ulong uVar17;
  int iVar21;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar28;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  pFVar9 = this->spec_;
  if ((pFVar9->type_ == '\0') || (pFVar9->type_ == 'c')) {
    AVar12 = (pFVar9->super_AlignSpec).align_;
    if ((AVar12 == ALIGN_NUMERIC) || (pFVar9->flags_ != 0)) {
      this_00 = (FormatError *)__cxa_allocate_exception(0x10);
      FormatError::FormatError(this_00,(CStringRef)0x1ec7ce);
      __cxa_throw(this_00,&FormatError::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar17 = (ulong)(pFVar9->super_AlignSpec).super_WidthSpec.width_;
    pBVar4 = this->writer_;
    if (uVar17 < 2) {
      puVar5 = *(undefined8 **)(pBVar4 + 8);
      lVar14 = puVar5[2];
      uVar17 = lVar14 + 1;
      puVar10 = puVar5;
      if ((ulong)puVar5[3] < uVar17) {
        (**(code **)*puVar5)(puVar5,uVar17);
        puVar10 = *(undefined8 **)(pBVar4 + 8);
      }
      puVar5[2] = uVar17;
      piVar16 = (int *)(lVar14 * 4 + puVar10[1]);
    }
    else {
      wVar2 = (pFVar9->super_AlignSpec).super_WidthSpec.fill_;
      puVar5 = *(undefined8 **)(pBVar4 + 8);
      lVar14 = puVar5[2];
      uVar17 = uVar17 + lVar14;
      puVar10 = puVar5;
      if ((ulong)puVar5[3] < uVar17) {
        (**(code **)*puVar5)(puVar5,uVar17);
        puVar10 = *(undefined8 **)(pBVar4 + 8);
        pFVar9 = this->spec_;
        AVar12 = (pFVar9->super_AlignSpec).align_;
      }
      puVar5[2] = uVar17;
      auVar8 = _DAT_001ebe10;
      auVar7 = _DAT_001ebe00;
      auVar6 = _DAT_001ebdf0;
      lVar11 = puVar10[1];
      piVar16 = (int *)(lVar11 + lVar14 * 4);
      uVar3 = (pFVar9->super_AlignSpec).super_WidthSpec.width_;
      if (AVar12 == ALIGN_CENTER) {
        uVar17 = (ulong)uVar3 - 1;
        uVar13 = uVar17 >> 1;
        if (1 < uVar17) {
          uVar17 = uVar13 + 0x3fffffffffffffff & 0x3fffffffffffffff;
          auVar26._8_4_ = (int)uVar17;
          auVar26._0_8_ = uVar17;
          auVar26._12_4_ = (int)(uVar17 >> 0x20);
          lVar1 = lVar11 + lVar14 * 4;
          lVar15 = 0;
          auVar26 = auVar26 ^ _DAT_001ebe10;
          do {
            auVar23._8_4_ = (int)lVar15;
            auVar23._0_8_ = lVar15;
            auVar23._12_4_ = (int)((ulong)lVar15 >> 0x20);
            auVar27 = (auVar23 | auVar7) ^ auVar8;
            iVar21 = auVar26._4_4_;
            if ((bool)(~(auVar27._4_4_ == iVar21 && auVar26._0_4_ < auVar27._0_4_ ||
                        iVar21 < auVar27._4_4_) & 1)) {
              *(wchar_t *)(lVar1 + lVar15 * 4) = wVar2;
            }
            if ((auVar27._12_4_ != auVar26._12_4_ || auVar27._8_4_ <= auVar26._8_4_) &&
                auVar27._12_4_ <= auVar26._12_4_) {
              *(wchar_t *)(lVar1 + 4 + lVar15 * 4) = wVar2;
            }
            auVar23 = (auVar23 | auVar6) ^ auVar8;
            iVar28 = auVar23._4_4_;
            if (iVar28 <= iVar21 && (iVar28 != iVar21 || auVar23._0_4_ <= auVar26._0_4_)) {
              *(wchar_t *)(lVar1 + 8 + lVar15 * 4) = wVar2;
              *(wchar_t *)(lVar1 + 0xc + lVar15 * 4) = wVar2;
            }
            lVar15 = lVar15 + 4;
          } while ((uVar17 - ((uint)(uVar13 + 0x3fffffffffffffff) & 3)) + 4 != lVar15);
        }
        auVar8 = _DAT_001ebe10;
        auVar7 = _DAT_001ebe00;
        auVar6 = _DAT_001ebdf0;
        piVar16 = piVar16 + uVar13;
        if (uVar3 != 1) {
          uVar17 = ((ulong)uVar3 * 4 + uVar13 * -4) - 8;
          auVar27._8_4_ = (int)uVar17;
          auVar27._0_8_ = uVar17;
          auVar27._12_4_ = (int)(uVar17 >> 0x20);
          auVar19._0_8_ = uVar17 >> 2;
          auVar19._8_8_ = auVar27._8_8_ >> 2;
          lVar11 = lVar11 + uVar13 * 4 + lVar14 * 4;
          uVar13 = 0;
          auVar19 = auVar19 ^ _DAT_001ebe10;
          do {
            auVar24._8_4_ = (int)uVar13;
            auVar24._0_8_ = uVar13;
            auVar24._12_4_ = (int)(uVar13 >> 0x20);
            auVar26 = (auVar24 | auVar7) ^ auVar8;
            iVar21 = auVar19._4_4_;
            if ((bool)(~(auVar26._4_4_ == iVar21 && auVar19._0_4_ < auVar26._0_4_ ||
                        iVar21 < auVar26._4_4_) & 1)) {
              *(wchar_t *)(lVar11 + 4 + uVar13 * 4) = wVar2;
            }
            if ((auVar26._12_4_ != auVar19._12_4_ || auVar26._8_4_ <= auVar19._8_4_) &&
                auVar26._12_4_ <= auVar19._12_4_) {
              *(wchar_t *)(lVar11 + 8 + uVar13 * 4) = wVar2;
            }
            auVar26 = (auVar24 | auVar6) ^ auVar8;
            iVar28 = auVar26._4_4_;
            if (iVar28 <= iVar21 && (iVar28 != iVar21 || auVar26._0_4_ <= auVar19._0_4_)) {
              *(wchar_t *)(lVar11 + 0xc + uVar13 * 4) = wVar2;
              *(wchar_t *)(lVar11 + 0x10 + uVar13 * 4) = wVar2;
            }
            uVar13 = uVar13 + 4;
          } while (((uVar17 >> 2) + 4 & 0xfffffffffffffffc) != uVar13);
        }
      }
      else if (AVar12 == ALIGN_RIGHT) {
        if (uVar3 - 1 == 0) {
          uVar17 = 0;
        }
        else {
          uVar17 = (ulong)(uVar3 - 1);
          uVar13 = uVar17 + 0x3fffffffffffffff & 0x3fffffffffffffff;
          auVar18._8_4_ = (int)uVar13;
          auVar18._0_8_ = uVar13;
          auVar18._12_4_ = (int)(uVar13 >> 0x20);
          lVar11 = lVar11 + lVar14 * 4;
          lVar14 = 0;
          auVar18 = auVar18 ^ _DAT_001ebe10;
          do {
            auVar22._8_4_ = (int)lVar14;
            auVar22._0_8_ = lVar14;
            auVar22._12_4_ = (int)((ulong)lVar14 >> 0x20);
            auVar26 = (auVar22 | auVar7) ^ auVar8;
            iVar21 = auVar18._4_4_;
            if ((bool)(~(auVar26._4_4_ == iVar21 && auVar18._0_4_ < auVar26._0_4_ ||
                        iVar21 < auVar26._4_4_) & 1)) {
              *(wchar_t *)(lVar11 + lVar14 * 4) = wVar2;
            }
            if ((auVar26._12_4_ != auVar18._12_4_ || auVar26._8_4_ <= auVar18._8_4_) &&
                auVar26._12_4_ <= auVar18._12_4_) {
              *(wchar_t *)(lVar11 + 4 + lVar14 * 4) = wVar2;
            }
            auVar26 = (auVar22 | auVar6) ^ auVar8;
            iVar28 = auVar26._4_4_;
            if (iVar28 <= iVar21 && (iVar28 != iVar21 || auVar26._0_4_ <= auVar18._0_4_)) {
              *(wchar_t *)(lVar11 + 8 + lVar14 * 4) = wVar2;
              *(wchar_t *)(lVar11 + 0xc + lVar14 * 4) = wVar2;
            }
            lVar14 = lVar14 + 4;
          } while ((uVar13 - ((uint)(uVar17 + 0x3fffffffffffffff) & 3)) + 4 != lVar14);
        }
        piVar16 = piVar16 + uVar17;
      }
      else if (uVar3 - 1 != 0) {
        uVar17 = (ulong)(uVar3 - 1) + 0x3fffffffffffffff;
        uVar13 = uVar17 & 0x3fffffffffffffff;
        auVar20._8_4_ = (int)uVar13;
        auVar20._0_8_ = uVar13;
        auVar20._12_4_ = (int)(uVar13 >> 0x20);
        lVar11 = lVar11 + lVar14 * 4;
        lVar14 = 0;
        auVar20 = auVar20 ^ _DAT_001ebe10;
        do {
          auVar25._8_4_ = (int)lVar14;
          auVar25._0_8_ = lVar14;
          auVar25._12_4_ = (int)((ulong)lVar14 >> 0x20);
          auVar26 = (auVar25 | auVar7) ^ auVar8;
          iVar21 = auVar20._4_4_;
          if ((bool)(~(auVar26._4_4_ == iVar21 && auVar20._0_4_ < auVar26._0_4_ ||
                      iVar21 < auVar26._4_4_) & 1)) {
            *(wchar_t *)(lVar11 + 4 + lVar14 * 4) = wVar2;
          }
          if ((auVar26._12_4_ != auVar20._12_4_ || auVar26._8_4_ <= auVar20._8_4_) &&
              auVar26._12_4_ <= auVar20._12_4_) {
            *(wchar_t *)(lVar11 + 8 + lVar14 * 4) = wVar2;
          }
          auVar26 = (auVar25 | auVar6) ^ auVar8;
          iVar28 = auVar26._4_4_;
          if (iVar28 <= iVar21 && (iVar28 != iVar21 || auVar26._0_4_ <= auVar20._0_4_)) {
            *(wchar_t *)(lVar11 + 0xc + lVar14 * 4) = wVar2;
            *(wchar_t *)(lVar11 + 0x10 + lVar14 * 4) = wVar2;
          }
          lVar14 = lVar14 + 4;
        } while ((uVar13 - ((uint)uVar17 & 3)) + 4 != lVar14);
      }
    }
    *piVar16 = value;
  }
  else {
    *(byte *)&pFVar9->flags_ = (byte)pFVar9->flags_ | 0x10;
    BasicWriter<wchar_t>::write_int<int,fmt::FormatSpec>(this->writer_,value,*pFVar9);
  }
  return;
}

Assistant:

void visit_char(int value) {
    if (spec_.type_ && spec_.type_ != 'c') {
      spec_.flags_ |= CHAR_FLAG;
      writer_.write_int(value, spec_);
      return;
    }
    if (spec_.align_ == ALIGN_NUMERIC || spec_.flags_ != 0)
      FMT_THROW(FormatError("invalid format specifier for char"));
    typedef typename BasicWriter<Char>::CharPtr CharPtr;
    Char fill = internal::CharTraits<Char>::cast(spec_.fill());
    CharPtr out = CharPtr();
    const unsigned char_width = 1;
    if (spec_.width_ > char_width) {
      out = writer_.grow_buffer(spec_.width_);
      if (spec_.align_ == ALIGN_RIGHT) {
        std::fill_n(out, spec_.width_ - char_width, fill);
        out += spec_.width_ - char_width;
      } else if (spec_.align_ == ALIGN_CENTER) {
        out = writer_.fill_padding(out, spec_.width_,
                                   internal::check(char_width), fill);
      } else {
        std::fill_n(out + char_width, spec_.width_ - char_width, fill);
      }
    } else {
      out = writer_.grow_buffer(char_width);
    }
    *out = internal::CharTraits<Char>::cast(value);
  }